

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

ssize_t __thiscall
wasm::LEB<long,_signed_char>::write(LEB<long,_signed_char> *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  byte local_29 [8];
  uint8_t byte;
  
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
            CONCAT44(in_register_00000034,__fd);
  uVar2 = this->value;
  do {
    uVar1 = uVar2 & 0xffffffff;
    local_29[0] = (byte)uVar2 & 0x7f;
    uVar3 = (long)uVar2 >> 7;
    if (uVar3 - 1 < 0xfffffffffffffffe) {
      __position._M_current = *(uchar **)(this_00 + 8);
    }
    else {
      __position._M_current = *(uchar **)(this_00 + 8);
      if (((uVar2 & 0x40) == 0) == -1 < this->value) {
        if (__position._M_current == *(uchar **)(this_00 + 0x10)) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>(this_00,__position,local_29);
          uVar1 = extraout_RAX;
        }
        else {
          *__position._M_current = local_29[0];
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
        }
        return uVar1;
      }
    }
    local_29[0] = (byte)uVar1 | 0x80;
    uVar2 = uVar3;
    if (__position._M_current == *(uchar **)(this_00 + 0x10)) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>(this_00,__position,local_29);
    }
    else {
      *__position._M_current = local_29[0];
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 1;
    }
  } while( true );
}

Assistant:

void write(std::vector<uint8_t>* out) {
    T temp = value;
    bool more;
    do {
      uint8_t byte = temp & 127;
      temp >>= 7;
      more = hasMore(temp, byte);
      if (more) {
        byte = byte | 128;
      }
      out->push_back(byte);
    } while (more);
  }